

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::TextFlow::Columns::iterator::iterator(iterator *this,Columns *columns)

{
  pointer *ppcVar1;
  Column *pCVar2;
  iterator __position;
  size_type __n;
  Column *col;
  Column *column;
  const_iterator local_68;
  
  this->m_columns = &columns->m_columns;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = (long)(columns->m_columns).
              super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(columns->m_columns).
              super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>.
              _M_impl.super__Vector_impl_data._M_start >> 6;
  this->m_activeIterators = __n;
  std::
  vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ::reserve(&this->m_iterators,__n);
  pCVar2 = (this->m_columns->
           super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (column = (this->m_columns->
                super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                )._M_impl.super__Vector_impl_data._M_start; column != pCVar2; column = column + 1) {
    Column::const_iterator::const_iterator(&local_68,column);
    __position._M_current =
         (this->m_iterators).
         super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_iterators).
        super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
      ::_M_realloc_insert<Catch::TextFlow::Column::const_iterator>
                (&this->m_iterators,__position,&local_68);
    }
    else {
      ((__position._M_current)->m_parsedTo).m_it._M_current = local_68.m_parsedTo.m_it._M_current;
      (__position._M_current)->m_addHyphen = local_68.m_addHyphen;
      *(undefined7 *)&(__position._M_current)->field_0x39 = local_68._57_7_;
      ((__position._M_current)->m_lineEnd).m_it._M_current = local_68.m_lineEnd.m_it._M_current;
      ((__position._M_current)->m_parsedTo).m_string = local_68.m_parsedTo.m_string;
      ((__position._M_current)->m_lineStart).m_it._M_current = local_68.m_lineStart.m_it._M_current;
      ((__position._M_current)->m_lineEnd).m_string = local_68.m_lineEnd.m_string;
      (__position._M_current)->m_column = local_68.m_column;
      ((__position._M_current)->m_lineStart).m_string = local_68.m_lineStart.m_string;
      ppcVar1 = &(this->m_iterators).
                 super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
  }
  return;
}

Assistant:

Columns::iterator::iterator( Columns const& columns ):
            m_columns( columns.m_columns ),
            m_activeIterators( m_columns.size() ) {

            m_iterators.reserve( m_columns.size() );
            for ( auto const& col : m_columns ) {
                m_iterators.push_back( col.begin() );
            }
        }